

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClassSymbols.cpp
# Opt level: O3

Type * __thiscall
slang::ast::GenericClassDefSymbol::getDefaultSpecialization
          (GenericClassDefSymbol *this,Scope *scope)

{
  bool bVar1;
  Type *pTVar2;
  ASTContext local_50;
  
  if ((this->defaultSpecialization).super__Optional_base<const_slang::ast::Type_*,_true,_true>.
      _M_payload.super__Optional_payload_base<const_slang::ast::Type_*>._M_engaged == true) {
    pTVar2 = (this->defaultSpecialization).
             super__Optional_base<const_slang::ast::Type_*,_true,_true>._M_payload.
             super__Optional_payload_base<const_slang::ast::Type_*>._M_payload._M_value;
  }
  else {
    local_50.lookupIndex = 0xffffffff;
    local_50.flags.m_bits = 0;
    local_50.instanceOrProc = (Symbol *)0x0;
    local_50.firstTempVar = (TempVarSymbol *)0x0;
    local_50.randomizeDetails = (RandomizeDetails *)0x0;
    local_50.assertionInstance = (AssertionInstanceDetails *)0x0;
    local_50.scope.ptr = scope;
    pTVar2 = getSpecializationImpl
                       (this,&local_50,(this->super_Symbol).location,false,
                        (ParameterValueAssignmentSyntax *)0x0);
    bVar1 = Scope::isUninstantiated(scope);
    if (!bVar1) {
      (this->defaultSpecialization).super__Optional_base<const_slang::ast::Type_*,_true,_true>.
      _M_payload.super__Optional_payload_base<const_slang::ast::Type_*>._M_payload._M_value = pTVar2
      ;
      (this->defaultSpecialization).super__Optional_base<const_slang::ast::Type_*,_true,_true>.
      _M_payload.super__Optional_payload_base<const_slang::ast::Type_*>._M_engaged = true;
    }
  }
  return pTVar2;
}

Assistant:

const Type* GenericClassDefSymbol::getDefaultSpecialization(const Scope& scope) const {
    if (defaultSpecialization)
        return *defaultSpecialization;

    auto result = getSpecializationImpl(ASTContext(scope, LookupLocation::max), location,
                                        /* forceInvalidParams */ false, nullptr);
    if (!scope.isUninstantiated())
        defaultSpecialization = result;
    return result;
}